

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O0

EigenConformable<true> *
pybind11::detail::EigenProps<Eigen::Matrix<double,_1,_5,_1,_1,_5>_>::conformable
          (EigenConformable<true> *__return_storage_ptr__,array *a)

{
  ssize_t sVar1;
  ssize_t sVar2;
  ssize_t sVar3;
  ssize_t sVar4;
  EigenIndex stride;
  EigenIndex n;
  EigenIndex np_cstride;
  EigenIndex np_rstride;
  EigenIndex np_cols;
  EigenIndex np_rows;
  ssize_t dims;
  array *a_local;
  
  sVar1 = array::ndim(a);
  if ((sVar1 < 1) || (2 < sVar1)) {
    EigenConformable<true>::EigenConformable(__return_storage_ptr__,false);
  }
  else if (sVar1 == 2) {
    sVar1 = array::shape(a,0);
    sVar2 = array::shape(a,1);
    sVar3 = array::strides(a,0);
    sVar4 = array::strides(a,1);
    if ((sVar1 == 1) && (sVar2 == 5)) {
      EigenConformable<true>::EigenConformable(__return_storage_ptr__,1,5,sVar3 / 8,sVar4 / 8);
    }
    else {
      EigenConformable<true>::EigenConformable(__return_storage_ptr__,false);
    }
  }
  else {
    sVar1 = array::shape(a,0);
    sVar2 = array::strides(a,0);
    if (sVar1 == 5) {
      EigenConformable<true>::EigenConformable(__return_storage_ptr__,1,5,sVar2 / 8);
    }
    else {
      EigenConformable<true>::EigenConformable(__return_storage_ptr__,false);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static EigenConformable<row_major> conformable(const array &a) {
        const auto dims = a.ndim();
        if (dims < 1 || dims > 2)
            return false;

        if (dims == 2) { // Matrix type: require exact match (or dynamic)

            EigenIndex
                np_rows = a.shape(0),
                np_cols = a.shape(1),
                np_rstride = a.strides(0) / static_cast<ssize_t>(sizeof(Scalar)),
                np_cstride = a.strides(1) / static_cast<ssize_t>(sizeof(Scalar));
            if ((fixed_rows && np_rows != rows) || (fixed_cols && np_cols != cols))
                return false;

            return {np_rows, np_cols, np_rstride, np_cstride};
        }

        // Otherwise we're storing an n-vector.  Only one of the strides will be used, but whichever
        // is used, we want the (single) numpy stride value.
        const EigenIndex n = a.shape(0),
              stride = a.strides(0) / static_cast<ssize_t>(sizeof(Scalar));

        if (vector) { // Eigen type is a compile-time vector
            if (fixed && size != n)
                return false; // Vector size mismatch
            return {rows == 1 ? 1 : n, cols == 1 ? 1 : n, stride};
        }
        else if (fixed) {
            // The type has a fixed size, but is not a vector: abort
            return false;
        }
        else if (fixed_cols) {
            // Since this isn't a vector, cols must be != 1.  We allow this only if it exactly
            // equals the number of elements (rows is Dynamic, and so 1 row is allowed).
            if (cols != n) return false;
            return {1, n, stride};
        }
        else {
            // Otherwise it's either fully dynamic, or column dynamic; both become a column vector
            if (fixed_rows && rows != n) return false;
            return {n, 1, stride};
        }
    }